

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_connection.c
# Opt level: O1

ngx_int_t ngx_clone_listening(ngx_conf_t *cf,ngx_listening_t *ls)

{
  void ***pppvVar1;
  void *__dest;
  long lVar2;
  undefined1 local_110 [8];
  ngx_listening_t ols;
  
  if ((ls->field_0xd9 & 0x10) == 0) {
    return 0;
  }
  memcpy(local_110,ls,0xe0);
  pppvVar1 = cf->cycle->conf_ctx[ngx_core_module.index];
  if (1 < (long)pppvVar1[4]) {
    lVar2 = 1;
    do {
      __dest = ngx_array_push(&cf->cycle->listening);
      if (__dest == (void *)0x0) {
        return -1;
      }
      memcpy(__dest,local_110,0xe0);
      *(long *)((long)__dest + 0xd0) = lVar2;
      lVar2 = lVar2 + 1;
    } while (lVar2 < (long)pppvVar1[4]);
  }
  return 0;
}

Assistant:

ngx_int_t
ngx_clone_listening(ngx_conf_t *cf, ngx_listening_t *ls)
{
#if (NGX_HAVE_REUSEPORT)

    ngx_int_t         n;
    ngx_core_conf_t  *ccf;
    ngx_listening_t   ols;

    if (!ls->reuseport) {
        return NGX_OK;
    }

    ols = *ls;

    ccf = (ngx_core_conf_t *) ngx_get_conf(cf->cycle->conf_ctx,
                                           ngx_core_module);

    for (n = 1; n < ccf->worker_processes; n++) {

        /* create a socket for each worker process */

        ls = ngx_array_push(&cf->cycle->listening);
        if (ls == NULL) {
            return NGX_ERROR;
        }

        *ls = ols;
        ls->worker = n;
    }

#endif

    return NGX_OK;
}